

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
          (directed_flag_complex_computer_t *this,int dimension)

{
  filtered_directed_graph_t *_graph;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  *pvVar1;
  value_type vVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  index_t iVar6;
  ostream *poVar7;
  long *plVar8;
  reference pvVar9;
  size_type sVar10;
  reference this_00;
  reference pvVar11;
  reference this_01;
  reference _coboundary_matrix;
  size_t sVar12;
  ostream *poVar13;
  compressed_sparse_matrix<int> *this_02;
  char *pcVar14;
  reference piVar15;
  reference pfVar16;
  int in_ESI;
  directed_flag_complex_computer_t *in_RDI;
  float f_3;
  iterator __end2;
  iterator __begin2;
  vector<float,_std::allocator<float>_> *__range2;
  ofstream o;
  string fname_2;
  const_iterator it;
  unsigned_long j;
  size_t this_size_1;
  index_t separator;
  ofstream o_1;
  string fname_3;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  store_coboundaries;
  size_t i_6;
  size_t _cell_count;
  size_t i_5;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  init_next_cell_cache;
  vector<unsigned_long,_std::allocator<unsigned_long>_> _cache_next_cells_offsets;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  _cache_next_cells;
  float f_2;
  iterator __end5;
  iterator __begin5;
  vector<float,_std::allocator<float>_> *__range5;
  size_t i_4;
  size_t i_3;
  size_t _cell_count_1;
  size_t i_2;
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  compute_filtration;
  size_t offset;
  size_t i_1;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  init_current_cell_cache;
  vector<unsigned_long,_std::allocator<unsigned_long>_> _cache_current_cells_offsets;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  _cache_current_cells;
  value_t next_value;
  ifstream f;
  string fname;
  index_t next_value_1;
  size_t this_size;
  ifstream f_1;
  string fname_1;
  size_t i;
  bool loaded_from_file;
  compressed_sparse_matrix<int> p;
  iterator __end1;
  iterator __begin1;
  vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_> *__range1;
  compressed_sparse_matrix<int> *in_stack_fffffffffffff038;
  uint in_stack_fffffffffffff040;
  undefined4 in_stack_fffffffffffff044;
  compressed_sparse_matrix<int> *in_stack_fffffffffffff048;
  short in_stack_fffffffffffff050;
  short in_stack_fffffffffffff052;
  undefined4 in_stack_fffffffffffff054;
  filtration_algorithm_t *in_stack_fffffffffffff058;
  string *psVar17;
  compute_filtration_t *in_stack_fffffffffffff060;
  size_type in_stack_fffffffffffff068;
  add_cell_index_to_cache_t *in_stack_fffffffffffff070;
  unsigned_long in_stack_fffffffffffff078;
  undefined8 in_stack_fffffffffffff088;
  int iVar18;
  undefined8 in_stack_fffffffffffff0d0;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  *in_stack_fffffffffffff0d8;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  *in_stack_fffffffffffff0e0;
  bool local_dda;
  float local_dbc;
  float *local_db8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_db0;
  vector<float,_std::allocator<float>_> *local_da8;
  char local_da0 [512];
  string local_ba0 [32];
  string local_b80 [64];
  _Deque_iterator<int,_const_int_&,_const_int_*> local_b40;
  ulong local_b20;
  size_t local_b18;
  undefined4 local_b0c;
  char local_b08 [512];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  ulong local_8a8;
  ulong local_8a0;
  store_coboundaries_in_cache_t local_898;
  ulong local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  ulong local_7a0;
  ulong local_780;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  *local_778;
  add_cell_index_to_cache_t local_770;
  ulong local_760;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  local_758;
  undefined8 local_738;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_730;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  local_710;
  float local_6f4;
  float *local_6f0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_6e8;
  undefined1 local_6e0 [24];
  undefined1 *local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  value_type local_6b0;
  ulong local_650;
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  local_648;
  value_type local_630;
  add_cell_index_to_cache_t local_628;
  ulong local_618;
  undefined8 local_5f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5e8;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  local_5c8;
  undefined1 local_5ac [4];
  char local_5a8 [520];
  string local_3a0 [32];
  string local_380 [36];
  int local_35c;
  long local_358;
  uint local_34c;
  char local_348 [520];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  ulong local_e0;
  byte local_d5;
  compressed_sparse_matrix<int> *local_28;
  __normal_iterator<compressed_sparse_matrix<int>_*,_std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>_>
  local_20;
  vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_> *local_18;
  int local_c;
  
  if (in_ESI != 0) {
    local_c = in_ESI;
    poVar7 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar7 = std::operator<<(poVar7,"preparing dimension ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c);
    poVar7 = std::operator<<(poVar7,": indexing ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c);
    poVar7 = std::operator<<(poVar7,"-dimensional cells");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar7,"\r");
    in_RDI->current_dimension = local_c;
    cell_hasher_t::set_current_cell_dimension((short)local_c + 1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff060,
               (size_type)in_stack_fffffffffffff058);
    local_18 = &in_RDI->coboundary_matrix;
    local_20._M_current =
         (compressed_sparse_matrix<int> *)
         std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
         ::begin(in_stack_fffffffffffff038);
    local_28 = (compressed_sparse_matrix<int> *)
               std::
               vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
               ::end((vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                      *)in_stack_fffffffffffff038);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<compressed_sparse_matrix<int>_*,_std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                              (__normal_iterator<compressed_sparse_matrix<int>_*,_std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>_>
                               *)in_stack_fffffffffffff038), bVar3) {
      __gnu_cxx::
      __normal_iterator<compressed_sparse_matrix<int>_*,_std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>_>
      ::operator*(&local_20);
      compressed_sparse_matrix<int>::compressed_sparse_matrix
                ((compressed_sparse_matrix<int> *)
                 CONCAT44(in_stack_fffffffffffff054,
                          CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                 in_stack_fffffffffffff048);
      compressed_sparse_matrix<int>::clear
                ((compressed_sparse_matrix<int> *)
                 CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
      compressed_sparse_matrix<int>::~compressed_sparse_matrix
                ((compressed_sparse_matrix<int> *)
                 CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
      __gnu_cxx::
      __normal_iterator<compressed_sparse_matrix<int>_*,_std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>_>
      ::operator++(&local_20);
    }
    if ((local_c <= (int)(uint)in_RDI->max_dimension) && ((in_RDI->_is_top_dimension & 1U) == 0)) {
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                              (char *)in_stack_fffffffffffff038);
      if (bVar3) {
        local_d5 = 0;
        for (local_e0 = 0; iVar18 = (int)((ulong)in_stack_fffffffffffff088 >> 0x20),
            local_e0 < in_RDI->nb_threads; local_e0 = local_e0 + 1) {
          std::
          vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
          operator[](&in_RDI->coboundary_matrix,local_e0);
          compressed_sparse_matrix<int>::clear
                    ((compressed_sparse_matrix<int> *)
                     CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
          std::__cxx11::string::string(local_100,(string *)&in_RDI->cache);
          std::__cxx11::string::operator+=(local_100,"/matrix_");
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff088 >> 0x20));
          std::__cxx11::string::operator+=(local_100,local_120);
          std::__cxx11::string::~string(local_120);
          std::__cxx11::string::operator+=(local_100,"_");
          std::__cxx11::to_string(in_stack_fffffffffffff078);
          std::__cxx11::string::operator+=(local_100,local_140);
          std::__cxx11::string::~string(local_140);
          pcVar14 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(local_348,pcVar14,_S_bin);
          if ((local_e0 == 0) && (bVar4 = std::ios::good(), (bVar4 & 1) == 0)) {
            local_34c = 4;
          }
          else {
            local_d5 = 1;
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&in_RDI->cell_count,(long)(in_RDI->current_dimension + 1));
            std::istream::read(local_348,(long)pvVar11);
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&in_RDI->coboundary_matrix_offsets,local_e0);
            std::istream::read(local_348,(long)pvVar11);
            std::istream::read(local_348,(long)&local_358);
            while( true ) {
              local_dda = false;
              if (local_358 != 0) {
                plVar8 = (long *)std::istream::read(local_348,(long)&local_35c);
                local_dda = std::ios::operator_cast_to_bool
                                      ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
              }
              if (local_dda == false) break;
              if (local_35c == -1) {
                std::
                vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                ::operator[](&in_RDI->coboundary_matrix,local_e0);
                compressed_sparse_matrix<int>::append_column
                          ((compressed_sparse_matrix<int> *)
                           CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
              }
              else {
                std::
                vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                ::operator[](&in_RDI->coboundary_matrix,local_e0);
                compressed_sparse_matrix<int>::push_back
                          ((compressed_sparse_matrix<int> *)
                           CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                           (int)((ulong)in_stack_fffffffffffff038 >> 0x20));
              }
            }
            std::ifstream::close();
            local_34c = 0;
          }
          std::ifstream::~ifstream(local_348);
          std::__cxx11::string::~string(local_100);
          iVar18 = (int)((ulong)in_stack_fffffffffffff088 >> 0x20);
          if (local_34c != 0) break;
        }
        std::__cxx11::string::string(local_380,(string *)&in_RDI->cache);
        std::__cxx11::string::operator+=(local_380,"/filtration_");
        std::__cxx11::to_string(iVar18);
        std::__cxx11::string::operator+=(local_380,local_3a0);
        std::__cxx11::string::~string(local_3a0);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(local_5a8,pcVar14,_S_bin);
        std::vector<float,_std::allocator<float>_>::clear
                  ((vector<float,_std::allocator<float>_> *)0x187cf0);
        while( true ) {
          plVar8 = (long *)std::istream::read(local_5a8,(long)local_5ac);
          bVar3 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
          if (!bVar3) break;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                     (value_type_conflict2 *)in_stack_fffffffffffff048);
        }
        std::ifstream::close();
        bVar3 = (local_d5 & 1) != 0;
        if (bVar3) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&in_RDI->cell_count,(long)(in_RDI->current_dimension + 1));
          in_RDI->_is_top_dimension = *pvVar11 == 0;
        }
        local_34c = (uint)bVar3;
        std::ifstream::~ifstream(local_5a8);
        std::__cxx11::string::~string(local_380);
        if (local_34c != 0) {
          return;
        }
      }
      if (in_RDI->filtration_algorithm != (filtration_algorithm_t *)0x0) {
        std::
        allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
        ::allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                     *)0x187ea8);
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                  *)in_stack_fffffffffffff060,(size_type)in_stack_fffffffffffff058,
                 (allocator_type *)
                 CONCAT44(in_stack_fffffffffffff054,
                          CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::
        allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
        ::~allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                      *)0x187ed4);
        local_5f0 = 0;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x187f09);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff060,(size_type)in_stack_fffffffffffff058,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffff054,
                            CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                   (allocator_type *)in_stack_fffffffffffff048);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x187f3d);
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                  *)0x187f4a);
        for (local_618 = 0; local_618 < in_RDI->nb_threads; local_618 = local_618 + 1) {
          pvVar9 = std::
                   vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   ::operator[](&local_5c8,local_618);
          add_cell_index_to_cache_t::add_cell_index_to_cache_t(&local_628,pvVar9);
          std::
          vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
          ::push_back((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                       *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                      (value_type *)in_stack_fffffffffffff038);
          add_cell_index_to_cache_t::~add_cell_index_to_cache_t(in_stack_fffffffffffff070);
        }
        cell_hasher_t::set_current_cell_dimension((unsigned_short)local_c);
        uVar5 = (*in_RDI->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
        if ((uVar5 & 1) != 0) {
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                    ((directed_flag_complex_t *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
                     (int)((ulong)in_stack_fffffffffffff0d0 >> 0x20),(int)in_stack_fffffffffffff0d0)
          ;
        }
        if (((int)(uint)in_RDI->min_dimension <= local_c + 1) ||
           (uVar5 = (*in_RDI->filtration_algorithm->_vptr_filtration_algorithm_t[5])(),
           (uVar5 & 1) != 0)) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\x1b[K");
          poVar7 = std::operator<<(poVar7,"preparing dimension ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c);
          poVar7 = std::operator<<(poVar7,": computing the filtration of all ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c + 1);
          poVar7 = std::operator<<(poVar7,"-dimensional cells");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
          std::operator<<(poVar7,"\r");
          local_630 = 0;
          std::
          vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ::vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                    *)0x188209);
          for (local_650 = 0; vVar2 = local_630, local_650 < in_RDI->nb_threads;
              local_650 = local_650 + 1) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&local_5e8,local_650);
            *pvVar11 = vVar2;
            uVar5 = (*in_RDI->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
            if ((uVar5 & 1) != 0) {
              std::
              vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              ::operator[](&local_5c8,local_650);
              sVar10 = std::
                       unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                       ::size((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                               *)0x1882aa);
              local_630 = sVar10 + local_630;
            }
            in_stack_fffffffffffff038 =
                 (compressed_sparse_matrix<int> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x18835e);
            compute_filtration_t::compute_filtration_t
                      (in_stack_fffffffffffff060,in_stack_fffffffffffff058,
                       (filtered_directed_graph_t *)
                       CONCAT44(in_stack_fffffffffffff054,
                                CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff048,
                       (vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                        *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                       (size_t)in_stack_fffffffffffff038,(size_t *)in_stack_fffffffffffff070);
            std::
            vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ::push_back((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                         *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                        (value_type *)in_stack_fffffffffffff038);
            compute_filtration_t::~compute_filtration_t((compute_filtration_t *)0x1883c2);
          }
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::compute_filtration_t>
                    ((directed_flag_complex_t *)in_stack_fffffffffffff0e0,
                     (vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                      *)in_stack_fffffffffffff0d8,(int)((ulong)in_stack_fffffffffffff0d0 >> 0x20),
                     (int)in_stack_fffffffffffff0d0);
          local_6b0 = 0;
          for (local_6b8 = 0; vVar2 = local_6b0, local_6b8 < in_RDI->nb_threads;
              local_6b8 = local_6b8 + 1) {
            this_00 = std::
                      vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                      ::operator[](&local_648,local_6b8);
            iVar6 = compute_filtration_t::number_of_cells(this_00);
            local_6b0 = (long)iVar6 + local_6b0;
          }
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&in_RDI->cell_count,(long)(local_c + 1));
          *pvVar11 = vVar2;
          if (local_6b0 == 0) {
            in_RDI->_is_top_dimension = true;
          }
          std::vector<float,_std::allocator<float>_>::clear
                    ((vector<float,_std::allocator<float>_> *)0x188516);
          std::vector<float,_std::allocator<float>_>::reserve
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff070,
                     in_stack_fffffffffffff068);
          for (local_6c0 = 0; local_6c0 < in_RDI->nb_threads; local_6c0 = local_6c0 + 1) {
            std::
            vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ::operator[](&local_648,local_6c0);
            compute_filtration_t::filtration((compute_filtration_t *)in_stack_fffffffffffff038);
            local_6c8 = local_6e0;
            local_6e8._M_current =
                 (float *)std::vector<float,_std::allocator<float>_>::begin
                                    ((vector<float,_std::allocator<float>_> *)
                                     in_stack_fffffffffffff038);
            local_6f0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                           ((vector<float,_std::allocator<float>_> *)
                                            in_stack_fffffffffffff038);
            while (bVar3 = __gnu_cxx::operator!=
                                     ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                       *)CONCAT44(in_stack_fffffffffffff044,
                                                  in_stack_fffffffffffff040),
                                      (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                       *)in_stack_fffffffffffff038), bVar3) {
              pfVar16 = __gnu_cxx::
                        __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                        operator*(&local_6e8);
              local_6f4 = *pfVar16;
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffff054,
                                  CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                         (value_type_conflict2 *)in_stack_fffffffffffff048);
              __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
              operator++(&local_6e8);
            }
            local_34c = 0x17;
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff054,
                                CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
          }
          std::
          vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ::~vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                     *)CONCAT44(in_stack_fffffffffffff054,
                                CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        }
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                   *)CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff054,
                            CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
      }
      if ((int)(uint)in_RDI->min_dimension <= local_c + 1) {
        cell_hasher_t::set_current_cell_dimension((short)local_c + 1);
        std::
        allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
        ::allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                     *)0x188737);
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                  *)in_stack_fffffffffffff060,(size_type)in_stack_fffffffffffff058,
                 (allocator_type *)
                 CONCAT44(in_stack_fffffffffffff054,
                          CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::
        allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
        ::~allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                      *)0x188763);
        local_738 = 0;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x188798);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff060,(size_type)in_stack_fffffffffffff058,
                   (value_type_conflict3 *)
                   CONCAT44(in_stack_fffffffffffff054,
                            CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)),
                   (allocator_type *)in_stack_fffffffffffff048);
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1887cc);
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                  *)0x1887d9);
        for (local_760 = 0; local_760 < in_RDI->nb_threads; local_760 = local_760 + 1) {
          pvVar9 = std::
                   vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   ::operator[](&local_710,local_760);
          add_cell_index_to_cache_t::add_cell_index_to_cache_t(&local_770,pvVar9);
          std::
          vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
          ::push_back((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                       *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                      (value_type *)in_stack_fffffffffffff038);
          add_cell_index_to_cache_t::~add_cell_index_to_cache_t(in_stack_fffffffffffff070);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar7 = std::operator<<(poVar7,"preparing dimension ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c);
        poVar7 = std::operator<<(poVar7,": indexing ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_c + 1);
        poVar7 = std::operator<<(poVar7,"-dimensional cells");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>)
        ;
        std::operator<<(poVar7,"\r");
        local_778 = (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                     *)0x0;
        bVar3 = is_top_dimension(in_RDI);
        if (!bVar3) {
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                    ((directed_flag_complex_t *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8,
                     (int)((ulong)in_stack_fffffffffffff0d0 >> 0x20),(int)in_stack_fffffffffffff0d0)
          ;
          for (local_780 = 0; local_780 < in_RDI->nb_threads; local_780 = local_780 + 1) {
            in_stack_fffffffffffff0e0 = local_778;
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&local_730,local_780);
            *pvVar11 = (value_type)in_stack_fffffffffffff0e0;
            this_01 = std::
                      vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                      ::operator[](&local_758,local_780);
            iVar6 = add_cell_index_to_cache_t::number_of_cells(this_01);
            local_778 = (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                         *)((long)&(local_778->
                                   super__Vector_base<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                                   )._M_impl.super__Vector_impl_data._M_start + (long)iVar6);
          }
          in_stack_fffffffffffff0d8 = local_778;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&in_RDI->cell_count,(long)(local_c + 1));
          *pvVar11 = (value_type)in_stack_fffffffffffff0d8;
          if (local_778 ==
              (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
               *)0x0) {
            in_RDI->_is_top_dimension = true;
          }
        }
        std::
        vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
        ::vector((vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                  *)0x188b3d);
        for (local_7a0 = 0; local_7a0 < in_RDI->nb_threads; local_7a0 = local_7a0 + 1) {
          in_stack_fffffffffffff0d0 = 0;
          local_7b8 = 0;
          uStack_7b0 = 0;
          local_7c8 = 0;
          uStack_7c0 = 0;
          local_7d8 = 0;
          uStack_7d0 = 0;
          local_7e8 = 0;
          uStack_7e0 = 0;
          local_7f8 = 0;
          uStack_7f0 = 0;
          local_808 = 0;
          uStack_800 = 0;
          local_818 = 0;
          uStack_810 = 0;
          local_828 = 0;
          uStack_820 = 0;
          local_838 = 0;
          uStack_830 = 0;
          local_848 = 0;
          uStack_840 = 0;
          compressed_sparse_matrix<int>::compressed_sparse_matrix
                    ((compressed_sparse_matrix<int> *)
                     CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
          std::
          vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
          operator[](&in_RDI->coboundary_matrix,local_7a0);
          compressed_sparse_matrix<int>::operator=
                    ((compressed_sparse_matrix<int> *)
                     CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                     in_stack_fffffffffffff038);
          compressed_sparse_matrix<int>::~compressed_sparse_matrix
                    ((compressed_sparse_matrix<int> *)
                     CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
        }
        for (local_850 = 0; local_850 < in_RDI->nb_threads; local_850 = local_850 + 1) {
          _coboundary_matrix =
               std::
               vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
               ::operator[](&in_RDI->coboundary_matrix,local_850);
          iVar18 = local_c;
          _graph = in_RDI->graph;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&in_RDI->cell_count,(long)local_c);
          in_stack_fffffffffffff038 = (compressed_sparse_matrix<int> *)(long)(int)*pvVar11;
          in_stack_fffffffffffff050 = in_RDI->modulus;
          in_stack_fffffffffffff052 = in_stack_fffffffffffff050 >> 0xf;
          in_stack_fffffffffffff040 = (uint)(local_850 == 0);
          store_coboundaries_in_cache_t::store_coboundaries_in_cache_t
                    (&local_898,_coboundary_matrix,iVar18,_graph,&local_710,&local_730,
                     (size_t)in_stack_fffffffffffff038,local_850 == 0,in_RDI->nb_threads,
                     in_stack_fffffffffffff050);
          std::
          vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
          ::push_back((vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                       *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                      (value_type *)in_stack_fffffffffffff038);
        }
        directed_flag_complex_t::
        for_each_cell<directed_flag_complex_computer::store_coboundaries_in_cache_t>
                  ((directed_flag_complex_t *)in_stack_fffffffffffff0e0,
                   (vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                    *)in_stack_fffffffffffff0d8,(int)((ulong)in_stack_fffffffffffff0d0 >> 0x20),
                   (int)in_stack_fffffffffffff0d0);
        local_778 = (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                     *)0x0;
        for (local_8a0 = 0; pvVar1 = local_778, local_8a0 < in_RDI->nb_threads;
            local_8a0 = local_8a0 + 1) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&in_RDI->coboundary_matrix_offsets,local_8a0);
          *pvVar11 = (value_type)pvVar1;
          std::
          vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
          operator[](&in_RDI->coboundary_matrix,local_8a0);
          sVar12 = compressed_sparse_matrix<int>::size((compressed_sparse_matrix<int> *)0x188e05);
          local_778 = (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                       *)(sVar12 + (long)local_778);
        }
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&in_RDI->cell_count,(long)local_c);
        *pvVar11 = (value_type)pvVar1;
        poVar7 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar7 = std::operator<<(poVar7,"preparing dimension ");
        poVar13 = (ostream *)std::ostream::operator<<(poVar7,local_c);
        this_02 = (compressed_sparse_matrix<int> *)
                  std::operator<<(poVar13,
                                  ": done computing coboundaries, now reducing memory consumption");
        poVar13 = (ostream *)
                  std::ostream::operator<<(this_02,std::flush<char,std::char_traits<char>>);
        std::operator<<(poVar13,"\r");
        std::
        vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
        ::~vector((vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                   *)CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                   *)CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffff054,
                            CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   *)CONCAT44(in_stack_fffffffffffff054,
                              CONCAT22(in_stack_fffffffffffff052,in_stack_fffffffffffff050)));
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                                (char *)in_stack_fffffffffffff038);
        if (bVar3) {
          for (local_8a8 = 0; iVar18 = (int)((ulong)poVar7 >> 0x20), local_8a8 < in_RDI->nb_threads;
              local_8a8 = local_8a8 + 1) {
            psVar17 = local_8c8;
            std::__cxx11::string::string(psVar17,(string *)&in_RDI->cache);
            std::__cxx11::string::operator+=(psVar17,"/matrix_");
            std::__cxx11::to_string((int)((ulong)poVar7 >> 0x20));
            std::__cxx11::string::operator+=(local_8c8,local_8e8);
            std::__cxx11::string::~string(local_8e8);
            std::__cxx11::string::operator+=(local_8c8,"_");
            std::__cxx11::to_string((unsigned_long)this_02);
            std::__cxx11::string::operator+=(local_8c8,local_908);
            std::__cxx11::string::~string(local_908);
            pcVar14 = (char *)std::__cxx11::string::c_str();
            std::ofstream::ofstream(local_b08,pcVar14,_S_bin);
            local_b0c = 0xffffffff;
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&in_RDI->cell_count,(long)(in_RDI->current_dimension + 1));
            std::ostream::write(local_b08,(long)pvVar11);
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&in_RDI->coboundary_matrix_offsets,local_8a8);
            std::ostream::write(local_b08,(long)pvVar11);
            std::
            vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
            operator[](&in_RDI->coboundary_matrix,local_8a8);
            local_b18 = compressed_sparse_matrix<int>::size
                                  ((compressed_sparse_matrix<int> *)0x1890e6);
            std::ostream::write(local_b08,(long)&local_b18);
            for (local_b20 = 0; local_b20 < local_b18; local_b20 = local_b20 + 1) {
              std::ostream::write(local_b08,(long)&local_b0c);
              std::
              vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
              ::operator[](&in_RDI->coboundary_matrix,local_8a8);
              compressed_sparse_matrix<int>::cbegin(this_02,(size_t)poVar13);
              while( true ) {
                std::
                vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>
                ::operator[](&in_RDI->coboundary_matrix,local_8a8);
                compressed_sparse_matrix<int>::cend(this_02,(size_t)poVar13);
                bVar3 = std::operator!=((_Self *)CONCAT44(in_stack_fffffffffffff044,
                                                          in_stack_fffffffffffff040),
                                        (_Self *)in_stack_fffffffffffff038);
                if (!bVar3) break;
                piVar15 = std::_Deque_iterator<int,_const_int_&,_const_int_*>::operator*(&local_b40)
                ;
                std::ostream::write(local_b08,(long)piVar15);
                std::_Deque_iterator<int,_const_int_&,_const_int_*>::operator++
                          ((_Deque_iterator<int,_const_int_&,_const_int_*> *)
                           CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
              }
            }
            std::ofstream::close();
            std::ofstream::~ofstream(local_b08);
            std::__cxx11::string::~string(local_8c8);
          }
          psVar17 = local_b80;
          std::__cxx11::string::string(psVar17,(string *)&in_RDI->cache);
          std::__cxx11::string::operator+=(psVar17,"/filtration_");
          std::__cxx11::to_string(iVar18);
          std::__cxx11::string::operator+=(local_b80,local_ba0);
          std::__cxx11::string::~string(local_ba0);
          pcVar14 = (char *)std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_da0,pcVar14,_S_bin);
          local_da8 = &in_RDI->next_filtration;
          local_db0._M_current =
               (float *)std::vector<float,_std::allocator<float>_>::begin
                                  ((vector<float,_std::allocator<float>_> *)
                                   in_stack_fffffffffffff038);
          local_db8 = (float *)std::vector<float,_std::allocator<float>_>::end
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffff038);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040)
                                    ,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                      *)in_stack_fffffffffffff038), bVar3) {
            pfVar16 = __gnu_cxx::
                      __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                      operator*(&local_db0);
            local_dbc = *pfVar16;
            std::ostream::write(local_da0,(long)&local_dbc);
            __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
            operator++(&local_db0);
          }
          std::ofstream::close();
          std::ofstream::~ofstream(local_da0);
          std::__cxx11::string::~string(local_b80);
        }
      }
    }
  }
  return;
}

Assistant:

void directed_flag_complex_computer_t::prepare_next_dimension(int dimension) {
	if (dimension == 0) return;

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "preparing dimension " << dimension << ": indexing " << (dimension) << "-dimensional cells"
	          << std::flush << "\r";
#endif

	assert(dimension == current_dimension + 1);
	current_dimension = dimension;
	cell_hasher_t::set_current_cell_dimension(dimension + 1);
	cell_count.resize(dimension + 2);

	// Clean up
	for (auto p : coboundary_matrix) { p.clear(); }

	if (dimension > max_dimension || _is_top_dimension) return;

	if (cache != "") {
#ifdef USE_COEFFICIENTS
		// TODO: Make this work
		std::string err_msg = "Sorry, caching does not work with coefficients yet.";
		throw std::logic_error(err_msg);
#endif
		bool loaded_from_file = false;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix[i].clear();
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ifstream f(fname.c_str(), std::ios::binary);
			if (i == 0 && !f.good()) break;
			loaded_from_file = true;

			f.read((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			f.read((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));

			size_t this_size;
			f.read((char*)&(this_size), sizeof(size_t));

			index_t next_value;
			while (this_size > 0 && f.read((char*)&next_value, sizeof(index_t))) {
				if (next_value == -1)
					coboundary_matrix[i].append_column();
				else
					coboundary_matrix[i].push_back(next_value);
			}
			f.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ifstream f(fname.c_str(), std::ios::binary);
		next_filtration.clear();
		value_t next_value;
		while (f.read((char*)&next_value, sizeof(value_t))) next_filtration.push_back(next_value);
		f.close();

		if (loaded_from_file) {
			_is_top_dimension = cell_count[current_dimension + 1] == 0;
			return;
		}
	}

	{
		if (filtration_algorithm != nullptr) {
			// Add the current and next cells into the hash and compute the new
			// filtration
			std::vector<cell_hash_map_t> _cache_current_cells(nb_threads);
			std::vector<size_t> _cache_current_cells_offsets(nb_threads, 0);
			std::vector<add_cell_index_to_cache_t> init_current_cell_cache;
			for (size_t i = 0; i < nb_threads; i++) {
				init_current_cell_cache.push_back(add_cell_index_to_cache_t(_cache_current_cells[i]));
			}

			cell_hasher_t::set_current_cell_dimension(dimension);

			// Add the current cells into the cache if the filtration algorithm
			// needs them
			if (filtration_algorithm->needs_face_filtration())
				flag_complex.for_each_cell(init_current_cell_cache, dimension);

			// If we will actually compute coboundaries, then compute the
			// filtration. Also if we need the face filtrations.
			if (dimension + 1 >= min_dimension || filtration_algorithm->needs_face_filtration()) {
#ifdef INDICATE_PROGRESS
				std::cout << "\033[K"
				          << "preparing dimension " << dimension << ": computing the filtration of all "
				          << (dimension + 1) << "-dimensional cells" << std::flush << "\r";
#endif
				size_t offset = 0;
				std::vector<compute_filtration_t> compute_filtration;
				for (size_t i = 0; i < nb_threads; i++) {
					_cache_current_cells_offsets[i] = offset;
					if (filtration_algorithm->needs_face_filtration()) { offset += _cache_current_cells[i].size(); }
					compute_filtration.push_back(compute_filtration_t(
					    filtration_algorithm, graph, dimension == 1 ? graph.edge_filtration : next_filtration,
					    _cache_current_cells, nb_threads, _cache_current_cells_offsets.data()));
				}
				flag_complex.for_each_cell(compute_filtration, dimension + 1);

				size_t _cell_count = 0;
				for (size_t i = 0; i < nb_threads; i++) _cell_count += compute_filtration[i].number_of_cells();
				cell_count[dimension + 1] = _cell_count;
				if (_cell_count == 0) _is_top_dimension = true;

				// Combine the filtration
				next_filtration.clear();
				next_filtration.reserve(_cell_count);
				for (size_t i = 0; i < nb_threads; i++) {
					for (auto f : compute_filtration[i].filtration()) next_filtration.push_back(f);
				}
			}
		}

		// If we do not want the homology in the next degree, then we can stop
		// here
		if (dimension + 1 < min_dimension) return;

		cell_hasher_t::set_current_cell_dimension(dimension + 1);

		std::vector<cell_hash_map_t> _cache_next_cells(nb_threads);
		std::vector<size_t> _cache_next_cells_offsets(nb_threads, 0);
		std::vector<add_cell_index_to_cache_t> init_next_cell_cache;
		for (size_t i = 0; i < nb_threads; i++) {
			init_next_cell_cache.push_back(add_cell_index_to_cache_t(_cache_next_cells[i]));
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension << ": indexing " << (dimension + 1) << "-dimensional cells"
		          << std::flush << "\r";
#endif

		size_t _cell_count = 0;

		if (!is_top_dimension()) {
			flag_complex.for_each_cell(init_next_cell_cache, dimension + 1);

			for (size_t i = 0; i < nb_threads; i++) {
				_cache_next_cells_offsets[i] = _cell_count;
				_cell_count += init_next_cell_cache[i].number_of_cells();
			}
			cell_count[dimension + 1] = _cell_count;
			if (_cell_count == 0) _is_top_dimension = true;
		}

		// Now compute the coboundaries
		std::vector<store_coboundaries_in_cache_t> store_coboundaries;
		for (size_t i = 0; i < nb_threads; i++) coboundary_matrix[i] = compressed_sparse_matrix<entry_t>();
		for (size_t i = 0; i < nb_threads; i++) {
			store_coboundaries.push_back(store_coboundaries_in_cache_t(
			    coboundary_matrix[i], dimension, graph, _cache_next_cells, _cache_next_cells_offsets,
			    int(cell_count[dimension]), i == 0, nb_threads, modulus));
		}
		flag_complex.for_each_cell(store_coboundaries, dimension);

		_cell_count = 0;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix_offsets[i] = _cell_count;
			_cell_count += coboundary_matrix[i].size();
		}
		cell_count[dimension] = _cell_count;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension
		          << ": done computing coboundaries, now reducing memory consumption" << std::flush << "\r";
#endif
	}

	if (cache != "") {
		for (size_t i = 0; i < nb_threads; i++) {
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ofstream o(fname.c_str(), std::ios::binary);
			index_t separator = -1;
			o.write((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			o.write((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));
			size_t this_size = coboundary_matrix[i].size();
			o.write((char*)&this_size, sizeof(size_t));
			for (auto j = 0ul; j < this_size; j++) {
				o.write((char*)&(separator), sizeof(index_t));
				for (auto it = coboundary_matrix[i].cbegin(j); it != coboundary_matrix[i].cend(j); ++it) {
					o.write((char*)&(*it), sizeof(index_t));
				}
			}
			o.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ofstream o(fname.c_str(), std::ios::binary);
		for (auto f : next_filtration) o.write((char*)&f, sizeof(value_t));
		o.close();
	}
}